

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper
          (QPDFNumberTreeObjectHelper *this,QPDFObjectHandle *oh,QPDF *q,bool auto_repair)

{
  Members *this_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_38,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)oh);
  QPDFObjectHelper::QPDFObjectHelper(&this->super_QPDFObjectHelper,(QPDFObjectHandle *)&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFNumberTreeObjectHelper_002af870;
  this_00 = (Members *)operator_new(0x10);
  Members::Members(this_00,oh,q,auto_repair);
  std::__shared_ptr<QPDFNumberTreeObjectHelper::Members,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<QPDFNumberTreeObjectHelper::Members,void>
            ((__shared_ptr<QPDFNumberTreeObjectHelper::Members,(__gnu_cxx::_Lock_policy)2> *)
             &this->m,this_00);
  return;
}

Assistant:

QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper(
    QPDFObjectHandle oh, QPDF& q, bool auto_repair) :
    QPDFObjectHelper(oh),
    m(new Members(oh, q, auto_repair))
{
}